

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O1

lys_module *
ly_ctx_load_sub_module
          (ly_ctx *ctx,lys_module *module,char *name,char *revision,int implement,
          unres_schema *unres)

{
  uint8_t uVar1;
  lys_module **pplVar2;
  int iVar3;
  LY_ERR *pLVar4;
  lys_module *plVar5;
  char *pcVar6;
  size_t sVar7;
  lys_module *plVar8;
  int *piVar9;
  char *pcVar10;
  char *pcVar11;
  char **ppcVar12;
  ulong uVar13;
  lys_revision *plVar14;
  ly_ctx *ctx_00;
  long lVar15;
  ulong uVar16;
  lys_module *plVar17;
  long lVar18;
  int in_stack_00000008;
  lys_module *in_stack_ffffffffffffef58;
  lys_module local_1098 [22];
  long local_90;
  unres_schema *local_88;
  lys_module *local_80;
  LYS_INFORMAT local_74;
  char *pcStack_70;
  LYS_INFORMAT format_1;
  lys_module *local_68;
  char *local_60;
  lys_module *local_58;
  char *local_50;
  int local_44;
  lys_module *local_40;
  LYS_INFORMAT format;
  
  local_88 = unres;
  local_68 = module;
  local_50 = name;
  _format = ctx;
  if (module == (lys_module *)0x0) {
    uVar13 = (ulong)ctx->internal_module_count;
    if (ctx->internal_module_count != 0) {
      ppcVar12 = &internal_modules[0].revision;
      uVar16 = 0;
      do {
        iVar3 = ly_strequal_(local_50,((internal_modules_s *)(ppcVar12 + -1))->name);
        if ((iVar3 != 0) &&
           ((revision == (char *)0x0 || (iVar3 = ly_strequal_(revision,*ppcVar12), iVar3 != 0)))) {
          plVar5 = ly_ctx_get_module_by(ctx,local_50,0,8,revision,0,in_stack_00000008);
          return plVar5;
        }
        uVar16 = uVar16 + 1;
        uVar13 = (ulong)ctx->internal_module_count;
        ppcVar12 = ppcVar12 + 4;
      } while (uVar16 < uVar13);
    }
    if ((int)uVar13 < (ctx->models).used) {
      plVar17 = (lys_module *)0x0;
      do {
        plVar5 = (ctx->models).list[uVar13];
        iVar3 = ly_strequal_(local_50,plVar5->name);
        plVar8 = plVar17;
        if (iVar3 != 0) {
          plVar8 = plVar5;
          if ((plVar17 != (lys_module *)0x0) &&
             (((plVar5->rev_size == '\0' || (plVar17->rev_size == '\0')) ||
              (iVar3 = strcmp(plVar5->rev->date,plVar17->rev->date), iVar3 < 1)))) {
            plVar8 = plVar17;
          }
          if (revision == (char *)0x0) {
            if ((plVar5->field_0x41 & 1) != 0) goto LAB_0010cd9b;
          }
          else if ((plVar5->rev_size != '\0') &&
                  (iVar3 = strcmp(revision,plVar5->rev->date), iVar3 == 0)) goto LAB_0010cd9b;
          if ((implement != 0) &&
             ((revision == (char *)0x0 && ((*(ushort *)&plVar5->field_0x40 & 0x80) != 0))))
          goto LAB_0010cd9b;
        }
        uVar13 = uVar13 + 1;
        ctx = _format;
        plVar17 = plVar8;
      } while ((int)uVar13 < (_format->models).used);
      plVar5 = (lys_module *)0x0;
    }
    else {
      plVar5 = (lys_module *)0x0;
      plVar8 = (lys_module *)0x0;
    }
LAB_0010cd9b:
    local_80 = plVar8;
    if (plVar5 != (lys_module *)0x0) {
      if ((plVar5->field_0x40 & 0x40) != 0) {
        lys_set_enabled(plVar5);
      }
      if (implement == 0) {
        return plVar5;
      }
      iVar3 = lys_set_implemented(plVar5);
      if (iVar3 == 0) {
        return plVar5;
      }
      return (lys_module *)0x0;
    }
  }
  else {
    local_80 = (lys_module *)0x0;
  }
  ctx_00 = _format;
  if ((_format->imp_clb != (ly_module_imp_clb)0x0) && (((_format->models).flags & 0x20) == 0))
  goto LAB_0010cdd6;
  do {
    plVar5 = (lys_module *)0x0;
    if (((ctx_00->models).flags & 8) == 0) {
      local_40 = (lys_module *)0x0;
      if (ctx_00 == (ly_ctx *)0x0) {
        ppcVar12 = (char **)0x0;
        ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid arguments (%s()).","ly_ctx_get_searchdirs")
        ;
      }
      else {
        ppcVar12 = (ctx_00->models).search_paths;
      }
      iVar3 = lys_search_localfile
                        (ppcVar12,(uint)(((ctx_00->models).flags & 0x10) == 0),local_50,revision,
                         (char **)&local_40,&local_74);
      plVar5 = (lys_module *)0x0;
      if (iVar3 != 0) goto LAB_0010cf65;
      if (local_40 == (lys_module *)0x0) {
        plVar5 = (lys_module *)0x0;
        if (local_68 == (lys_module *)0x0 && revision == (char *)0x0) {
          plVar5 = ly_ctx_get_module_by
                             (ctx_00,local_50,0,8,(char *)0x0,0,(int)in_stack_ffffffffffffef58);
        }
        if (plVar5 == (lys_module *)0x0) {
          ly_log(ctx_00,LY_LLERR,LY_ESYS,"Data model \"%s\" not found.",local_50);
        }
        goto LAB_0010cf6e;
      }
      local_44 = implement;
      ly_log((ly_ctx *)0x0,LY_LLVRB,LY_SUCCESS,"Loading schema from \"%s\" file.");
      pcStack_70 = strrchr((char *)local_40,0x2e);
      pcStack_70[1] = '\0';
      local_60 = revision;
      if ((revision == (char *)0x0) && (lVar18 = (long)(_format->models).used, 0 < lVar18)) {
        pplVar2 = (_format->models).list;
        local_58 = local_40;
        lVar15 = 0;
        local_90 = lVar18;
        do {
          plVar5 = pplVar2[lVar15];
          pcVar6 = plVar5->filepath;
          if ((pcVar6 != (char *)0x0) &&
             (iVar3 = strcmp(local_50,plVar5->name), plVar8 = local_58, iVar3 == 0)) {
            sVar7 = strlen((char *)local_58);
            lVar18 = local_90;
            iVar3 = strncmp((char *)plVar8,pcVar6,sVar7);
            ctx_00 = _format;
            implement = local_44;
            revision = local_60;
            if (iVar3 == 0) {
              if ((local_44 == 0) || ((plVar5->field_0x40 & 0x80) != 0)) {
                if ((plVar5->field_0x40 & 0x40) != 0) {
                  lys_set_enabled(plVar5);
                }
              }
              else {
                iVar3 = lys_set_implemented(plVar5);
                ctx_00 = _format;
                revision = local_60;
                if (iVar3 != 0) {
                  plVar5 = (lys_module *)0x0;
                }
              }
              goto LAB_0010cf65;
            }
          }
          lVar15 = lVar15 + 1;
        } while (lVar18 != lVar15);
      }
      pcStack_70[1] = 'y';
      iVar3 = open((char *)local_40,0);
      ctx_00 = _format;
      plVar8 = local_40;
      implement = local_44;
      revision = local_60;
      if (iVar3 < 0) {
        piVar9 = __errno_location();
        pcVar6 = strerror(*piVar9);
        ctx_00 = _format;
        plVar5 = (lys_module *)0x0;
        ly_log(_format,LY_LLERR,LY_ESYS,"Unable to open data model file \"%s\" (%s).",plVar8,pcVar6)
        ;
        revision = local_60;
        implement = local_44;
      }
      else {
        if (local_68 == (lys_module *)0x0) {
          plVar8 = lys_parse_fd_(_format,iVar3,local_74,local_60,local_44);
        }
        else {
          plVar8 = (lys_module *)lys_sub_parse_fd(local_68,iVar3,local_74,local_88);
        }
        close(iVar3);
        plVar17 = local_40;
        plVar5 = (lys_module *)0x0;
        if (plVar8 != (lys_module *)0x0) {
          pcVar6 = strrchr((char *)local_40,0x2f);
          plVar5 = (lys_module *)(pcVar6 + 1);
          if (pcVar6 == (char *)0x0) {
            plVar5 = plVar17;
          }
          pcVar10 = strchr((char *)plVar5,0x40);
          pcVar6 = plVar8->name;
          local_58 = plVar8;
          sVar7 = strlen(pcVar6);
          iVar3 = strncmp((char *)plVar5,pcVar6,sVar7);
          if (iVar3 == 0) {
            pcVar11 = pcVar10;
            if (pcVar10 == (char *)0x0) {
              pcVar11 = pcStack_70;
            }
            if (plVar5->padding2 + (sVar7 - 0x42) != (uint8_t *)pcVar11) goto LAB_0010d1e9;
          }
          else {
LAB_0010d1e9:
            ly_log(_format,LY_LLWRN,LY_SUCCESS,"File name \"%s\" does not match module name \"%s\"."
                   ,plVar5,pcVar6);
          }
          ctx_00 = _format;
          if ((pcVar10 != (char *)0x0) &&
             (((uVar1 = local_58->rev_size, uVar1 == '\0' ||
               ((long)pcStack_70 - (long)(pcVar10 + 1) != 10)) ||
              (iVar3 = strncmp(local_58->rev->date,pcVar10 + 1,10), iVar3 != 0)))) {
            pcVar6 = "none";
            if (uVar1 != '\0') {
              pcVar6 = local_58->rev->date;
            }
            ly_log(ctx_00,LY_LLWRN,LY_SUCCESS,
                   "File name \"%s\" does not match module revision \"%s\".",plVar5,pcVar6);
          }
          plVar5 = local_58;
          implement = local_44;
          if (local_58->filepath == (char *)0x0) {
            pcVar6 = realpath((char *)local_40,(char *)local_1098);
            implement = local_44;
            plVar8 = local_40;
            if (pcVar6 != (char *)0x0) {
              plVar8 = local_1098;
            }
            pcVar6 = lydict_insert(ctx_00,(char *)plVar8,0);
            plVar5->filepath = pcVar6;
          }
        }
      }
LAB_0010cf65:
      free(local_40);
    }
LAB_0010cf6e:
    if (plVar5 != (lys_module *)0x0) goto LAB_0010cf82;
    if (((ctx_00->models).flags & 0x20) == 0) break;
LAB_0010cdd6:
    plVar5 = (lys_module *)0x0;
    if (ctx_00->imp_clb != (ly_module_imp_clb)0x0) {
      local_40 = (lys_module *)((ulong)local_40 & 0xffffffff00000000);
      in_stack_ffffffffffffef58 = local_1098;
      local_1098[0].ctx = (ly_ctx *)0x0;
      pLVar4 = ly_errno_glob_address();
      *pLVar4 = LY_SUCCESS;
      if (local_68 == (lys_module *)0x0) {
        plVar5 = (lys_module *)0x0;
        pcVar6 = (*ctx_00->imp_clb)(local_50,revision,(char *)0x0,(char *)0x0,ctx_00->imp_clb_data,
                                    (LYS_INFORMAT *)&local_40,
                                    (_func_void_void_ptr_void_ptr **)in_stack_ffffffffffffef58);
      }
      else {
        plVar5 = lys_main_module(local_68);
        plVar14 = (lys_revision *)0x0;
        if (plVar5->rev_size != '\0') {
          plVar14 = plVar5->rev;
        }
        pcVar6 = (*ctx_00->imp_clb)(plVar5->name,plVar14->date,local_50,revision,
                                    ctx_00->imp_clb_data,(LYS_INFORMAT *)&local_40,
                                    (_func_void_void_ptr_void_ptr **)in_stack_ffffffffffffef58);
      }
      if (pcVar6 == (char *)0x0) {
        pLVar4 = ly_errno_glob_address();
        ctx_00 = _format;
        if (*pLVar4 != LY_SUCCESS) {
          pLVar4 = ly_errno_glob_address();
          plVar5 = (lys_module *)0x0;
          ly_log(ctx_00,LY_LLERR,*pLVar4,"User module retrieval callback failed!");
        }
      }
      else {
        if (local_68 == (lys_module *)0x0) {
          plVar5 = lys_parse_mem_(_format,pcVar6,(LYS_INFORMAT)local_40,(char *)0x0,0,implement);
        }
        else {
          plVar5 = (lys_module *)lys_sub_parse_mem(local_68,pcVar6,(LYS_INFORMAT)local_40,local_88);
        }
        ctx_00 = _format;
        if (local_1098[0].ctx != (ly_ctx *)0x0) {
          (*(code *)local_1098[0].ctx)();
        }
      }
    }
    if (plVar5 != (lys_module *)0x0) goto LAB_0010cf82;
  } while (((ctx_00->models).flags & 0x20) == 0);
  plVar5 = (lys_module *)0x0;
LAB_0010cf82:
  if (local_80 == (lys_module *)0x0) {
    local_80 = plVar5;
  }
  if (plVar5 != (lys_module *)0x0) {
    local_80 = plVar5;
  }
  if ((revision == (char *)0x0) && (local_80 != (lys_module *)0x0)) {
    local_80->field_0x41 = local_80->field_0x41 | 1;
  }
  return local_80;
}

Assistant:

const struct lys_module *
ly_ctx_load_sub_module(struct ly_ctx *ctx, struct lys_module *module, const char *name, const char *revision,
                       int implement, struct unres_schema *unres)
{
    struct lys_module *mod = NULL, *latest_mod = NULL;
    int i;

    if (!module) {
        /* exception for internal modules */
        for (i = 0; i < ctx->internal_module_count; i++) {
            if (ly_strequal(name, internal_modules[i].name, 0)) {
                if (!revision || ly_strequal(revision, internal_modules[i].revision, 0)) {
                    /* return internal module */
                    return (struct lys_module *)ly_ctx_get_module(ctx, name, revision, 0);
                }
            }
        }
        /* try to get the schema from the context (with or without revision),
         * include the disabled modules in the search to avoid their duplication,
         * they are enabled by the subsequent call to lys_set_implemented() */
        for (i = ctx->internal_module_count, mod = NULL; i < ctx->models.used; i++) {
            mod = ctx->models.list[i]; /* shortcut */
            if (ly_strequal(name, mod->name, 0)) {
                /* first remember latest module if no other is found */
                if (!latest_mod) {
                    latest_mod = mod;
                } else {
                    if (mod->rev_size && latest_mod->rev_size && (strcmp(mod->rev[0].date, latest_mod->rev[0].date) > 0)) {
                        /* newer revision */
                        latest_mod = mod;
                    }
                }

                if (revision && mod->rev_size && !strcmp(revision, mod->rev[0].date)) {
                    /* the specific revision was already loaded */
                    break;
                } else if (!revision && mod->latest_revision) {
                    /* the latest revision of this module was already loaded */
                    break;
                } else if (implement && mod->implemented && !revision) {
                    /* we are not able to implement another module, so consider this module as the latest one */
                    break;
                }
            }
            mod = NULL;
        }
        if (mod) {
            /* module must be enabled */
            if (mod->disabled) {
                lys_set_enabled(mod);
            }
            /* module is supposed to be implemented */
            if (implement && lys_set_implemented(mod)) {
                /* the schema cannot be implemented */
                mod = NULL;
            }
            return mod;
        }
    }

    /* module is not yet in context, use the user callback or try to find the schema on our own */
    if (ctx->imp_clb && !(ctx->models.flags & LY_CTX_PREFER_SEARCHDIRS)) {
search_clb:
        if (ctx->imp_clb) {
            mod = ly_ctx_load_sub_module_clb(ctx, module, name, revision, implement, unres);
        }
        if (!mod && !(ctx->models.flags & LY_CTX_PREFER_SEARCHDIRS)) {
            goto search_file;
        }
    } else {
search_file:
        if (!(ctx->models.flags & LY_CTX_DISABLE_SEARCHDIRS)) {
            /* module was not received from the callback or there is no callback set */
            mod = ly_ctx_load_localfile(ctx, module, name, revision, implement, unres);
        }
        if (!mod && (ctx->models.flags & LY_CTX_PREFER_SEARCHDIRS)) {
            goto search_clb;
        }
    }

    if (!mod && latest_mod) {
        /* consider the latest mod found as the latest available */
        mod = latest_mod;
    }

#ifdef LY_ENABLED_LATEST_REVISIONS
    if (!revision && mod) {
        /* module is the latest revision found */
        mod->latest_revision = 1;
    }
#endif

    return mod;
}